

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data,double value)

{
  SmallBuffer *store;
  int32_t iVar1;
  double local_18;
  
  local_18 = value;
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    helics::ValueConverter<double>::convert(&local_18,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data, double value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<double>::convert(value, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}